

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool mjs::is_strict_mode_directive(expression *e)

{
  bool bVar1;
  int iVar2;
  source_extend *this;
  token *this_00;
  wstring *__lhs;
  wstring_view local_30;
  literal_expression *local_20;
  literal_expression *le;
  expression *e_local;
  
  le = (literal_expression *)e;
  bVar1 = is_directive(e);
  if (bVar1) {
    local_20 = le;
    this = syntax_node::extend((syntax_node *)le);
    local_30 = source_extend::source_view(this);
    iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_30,1,10,L"use strict");
    if (iVar2 == 0) {
      this_00 = literal_expression::t(local_20);
      __lhs = token::text_abi_cxx11_(this_00);
      bVar1 = std::operator==(__lhs,L"use strict");
      if (!bVar1) {
        __assert_fail("le.t().text() == strict_directive",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0xc1,"bool mjs::is_strict_mode_directive(const expression &)");
      }
      e_local._7_1_ = true;
    }
    else {
      e_local._7_1_ = false;
    }
  }
  else {
    e_local._7_1_ = false;
  }
  return e_local._7_1_;
}

Assistant:

bool is_strict_mode_directive(const expression& e) {
    if (!is_directive(e)) {
        return false;
    }
    const auto& le = static_cast<const literal_expression&>(e);
    // Check spelling of directive, "A Use Strict Directive may not contain an EscapeSequence or LineContinuation."
    if (le.extend().source_view().compare(1, sizeof(strict_directive)/sizeof(*strict_directive) -1, strict_directive) != 0) {
        return false;
    }
    assert(le.t().text() == strict_directive);
    return true;
}